

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::advance_past_deleted
          (sparse_hashtable_destructive_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::sparse_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *this)

{
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psVar1;
  sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *psVar2;
  nonempty_iterator ppVar3;
  
  while ((((((this->pos).row_begin._M_current != (this->end).row_begin._M_current ||
            (psVar1 = (this->pos).row_end._M_current, psVar1 != (this->end).row_end._M_current)) ||
           (psVar2 = (this->pos).row_current._M_current,
           psVar2 != (this->end).row_current._M_current)) ||
          ((psVar2 != psVar1 && ((this->pos).col_current != (this->end).col_current)))) &&
         ((this->ht->num_deleted != 0 &&
          (ppVar3 = (this->pos).col_current, (this->ht->key_info).delkey == ppVar3->first))))) {
    (this->pos).col_current = ppVar3 + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>_>_>_>
    ::advance_past_end(&this->pos);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }